

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O0

void __thiscall TernaryReturned::TernaryReturned(TernaryReturned *this,Exception e)

{
  allocator<char> local_39;
  string local_38;
  TernaryReturned *local_18;
  TernaryReturned *this_local;
  Exception e_local;
  
  local_18 = this;
  this_local = (TernaryReturned *)e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Item::Item(&this->item,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this->exception = (Exception)this_local;
  return;
}

Assistant:

TernaryReturned(Exception e) : item(Item("")), exception(e) {}